

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
::lower_bound<std::__cxx11::string>
          (btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
          key_compare *comp)

{
  byte bVar1;
  bool bVar2;
  key_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  bVar1 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
          ::count((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                   *)this);
  uVar4 = 0;
  uVar3 = (uint)bVar1;
  while (uVar5 = uVar3, uVar4 != uVar5) {
    uVar3 = (int)(uVar4 + uVar5) >> 1;
    this_00 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::key((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                     *)this,(long)(int)uVar3);
    bVar2 = (anonymous_namespace)::NonTransparentCompare::operator()(this_00,k,u);
    if (bVar2) {
      uVar4 = uVar3 + 1;
      uVar3 = uVar5;
    }
  }
  return (SearchResult<int,_false>)uVar5;
}

Assistant:

SearchResult<int, is_key_compare_to::value> lower_bound(
            const K &k, const key_compare &comp) const {
            return use_linear_search::value ? linear_search(k, comp)
                : binary_search(k, comp);
        }